

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_icu::num_format<wchar_t>::do_real_put<long_double>
          (num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          longdouble val)

{
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __last;
  undefined1 uVar1;
  fmtflags __a;
  _Ios_Fmtflags _Var2;
  pointer pfVar3;
  streamsize sVar4;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *poVar5;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *this_00;
  ios_base *in_RCX;
  bool in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> oVar6;
  iter_type iVar7;
  longdouble in_stack_00000008;
  fmtflags flags;
  streamsize n;
  streamsize points;
  streamsize on_right;
  streamsize on_left;
  string_type *str;
  size_t code_points;
  formatter_ptr formatter;
  string *e;
  undefined2 in_stack_fffffffffffffe80;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffe82;
  undefined4 in_stack_fffffffffffffe88;
  wchar_t in_stack_fffffffffffffe8c;
  wchar_t __c;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *in_stack_fffffffffffffe90;
  undefined2 in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined6 in_stack_fffffffffffffeb8;
  byte bVar9;
  undefined1 uVar10;
  undefined7 in_stack_fffffffffffffec8;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __first;
  long local_e0;
  long local_d8;
  wstring local_d0 [32];
  wstring *local_b0;
  long local_a8;
  undefined4 local_9c;
  streambuf_type *local_98;
  undefined1 local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  bool bStack_80;
  undefined3 uStack_7f;
  undefined4 uStack_7c;
  byte local_69;
  longdouble local_48;
  undefined4 local_34;
  ios_base *local_30;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_20;
  streambuf_type *local_10;
  undefined8 local_8;
  
  local_20._M_failed = in_DL;
  local_48 = in_stack_00000008;
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_20._M_sbuf = in_RSI;
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>>
  ::unique_ptr<std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>,void>
            ((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
              *)CONCAT62(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80));
  local_69 = 0;
  e = SUB108(local_48,0);
  uVar8 = (undefined2)((unkuint10)local_48 >> 0x40);
  uVar1 = num_base::use_parent<long_double>
                    ((ios_base *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                     (longdouble)CONCAT28(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90));
  bVar9 = true;
  if (!(bool)uVar1) {
    formatter<wchar_t>::create
              ((ios_base *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (Locale *)CONCAT62(in_stack_fffffffffffffe82,uVar8),e);
    local_69 = 1;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
    ::operator=((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)CONCAT62(in_stack_fffffffffffffe82,uVar8),
                (unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)e);
    pfVar3 = std::
             unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
             ::get((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                    *)CONCAT62(in_stack_fffffffffffffe82,uVar8));
    bVar9 = pfVar3 == (pointer)0x0;
  }
  uVar10 = bVar9;
  if ((local_69 & 1) != 0) {
    std::
    unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
    ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                   *)CONCAT62(in_stack_fffffffffffffe82,uVar8));
  }
  if ((bVar9 & 1) == 0) {
    pfVar3 = std::
             unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
             ::operator->((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                           *)0x2782e4);
    __first._M_current = (wchar_t *)(double)local_48;
    (*(pfVar3->super_base_formatter)._vptr_base_formatter[2])
              ((int)__first._M_current,local_d0,pfVar3,&local_a8);
    local_b0 = local_d0;
    local_d8 = 0;
    local_e0 = 0;
    sVar4 = std::ios_base::width(local_30);
    if (local_a8 < sVar4) {
      sVar4 = std::ios_base::width(local_30);
      __a = std::ios_base::flags(local_30);
      _Var2 = std::operator&(__a,_S_adjustfield);
      if (_Var2 != _S_left) {
        local_d8 = sVar4 - local_a8;
      }
      local_e0 = (sVar4 - local_a8) - local_d8;
    }
    for (; 0 < local_d8; local_d8 = local_d8 + -1) {
      poVar5 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                         (&local_20,0);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(poVar5);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    }
    std::__cxx11::wstring::begin();
    std::__cxx11::wstring::end();
    __last._M_current._7_1_ = uVar1;
    __last._M_current._0_7_ = in_stack_fffffffffffffec8;
    oVar6._M_sbuf._6_1_ = bVar9;
    oVar6._M_sbuf._0_6_ = in_stack_fffffffffffffeb8;
    oVar6._M_sbuf._7_1_ = uVar10;
    oVar6._8_8_ = in_RDI;
    oVar6 = std::
            copy<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                      (__first,__last,oVar6);
    poVar5 = (ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)oVar6._M_sbuf;
    __c = CONCAT13(oVar6._M_failed,(int3)in_stack_fffffffffffffe8c);
    for (; 0 < local_e0; local_e0 = local_e0 + -1) {
      this_00 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                          (&local_20,0);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(this_00);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=(poVar5,__c);
    }
    std::ios_base::width(local_30,0);
    local_10 = local_20._M_sbuf;
    local_8 = CONCAT44(local_20._12_4_,local_20._8_4_);
    local_9c = 1;
    std::__cxx11::wstring::~wstring(local_d0);
  }
  else {
    local_88 = local_20._M_sbuf._0_4_;
    uStack_84 = local_20._M_sbuf._4_4_;
    bStack_80 = local_20._M_failed;
    uStack_7f = local_20._9_3_;
    uStack_7c = local_20._12_4_;
    uVar8 = (undefined2)((unkuint10)local_48 >> 0x40);
    local_98 = (streambuf_type *)
               std::num_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
               do_put(in_RDI,local_20._M_sbuf,local_20._8_4_,local_30,local_34,in_R9,
                      SUB108(local_48,0));
    local_8 = CONCAT71(local_8._1_7_,extraout_DL);
    local_9c = 1;
    local_90 = extraout_DL;
    local_10 = local_98;
  }
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
  ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)CONCAT62(in_stack_fffffffffffffe82,uVar8));
  iVar7._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar7._M_failed = (bool)(undefined1)local_8;
  iVar7._M_sbuf = local_10;
  return iVar7;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }